

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepScanLineOutputFile::writePixels(DeepScanLineOutputFile *this,int numScanLines)

{
  int *piVar1;
  Data *pDVar2;
  pointer ppLVar3;
  LineBuffer *pLVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  LineBufferTask *pLVar8;
  ArgExc *pAVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int scanLineMin;
  int iVar13;
  TaskGroup taskGroup;
  int local_1e4;
  int local_1d4;
  int local_1c4;
  TaskGroup local_1b8 [392];
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this->_data->_streamData);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar2->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = (long)(pDVar2->currentScanLine - pDVar2->minY) / (long)pDVar2->linesInBuffer;
    uVar11 = uVar5 & 0xffffffff;
    IlmThread_3_4::TaskGroup::TaskGroup(local_1b8);
    pDVar2 = this->_data;
    iVar6 = pDVar2->currentScanLine;
    iVar13 = (int)uVar5;
    iVar12 = (int)((ulong)((long)(pDVar2->lineBuffers).
                                 super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar2->lineBuffers).
                                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (pDVar2->lineOrder == INCREASING_Y) {
      local_1c4 = numScanLines + iVar6 + -1;
      local_1d4 = (local_1c4 - pDVar2->minY) / pDVar2->linesInBuffer;
      iVar10 = (local_1d4 - iVar13) + 1;
      if (iVar12 <= iVar10) {
        iVar10 = iVar12;
      }
      local_1e4 = 1;
      if (1 < iVar10) {
        local_1e4 = iVar10;
      }
      iVar12 = local_1e4;
      do {
        pLVar8 = (LineBufferTask *)operator_new(0x20);
        anon_unknown_7::LineBufferTask::LineBufferTask
                  (pLVar8,local_1b8,this->_data,(int)uVar11,iVar6,local_1c4);
        IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pLVar8);
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      local_1d4 = local_1d4 + 1;
      iVar12 = 1;
    }
    else {
      local_1d4 = ((iVar6 - (pDVar2->minY + numScanLines)) + 1) / pDVar2->linesInBuffer;
      scanLineMin = (iVar6 - numScanLines) + 1;
      iVar10 = (iVar13 - local_1d4) + 1;
      if (iVar12 <= iVar10) {
        iVar10 = iVar12;
      }
      iVar12 = 1;
      local_1e4 = 1;
      if (1 < iVar10) {
        iVar12 = iVar10;
        local_1e4 = iVar10;
      }
      do {
        pLVar8 = (LineBufferTask *)operator_new(0x20);
        anon_unknown_7::LineBufferTask::LineBufferTask
                  (pLVar8,local_1b8,this->_data,(int)uVar11,scanLineMin,iVar6);
        IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pLVar8);
        uVar11 = (ulong)((int)uVar11 - 1);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      local_1e4 = -local_1e4;
      local_1d4 = local_1d4 + -1;
      iVar12 = -1;
      local_1c4 = iVar6;
      iVar6 = scanLineMin;
    }
    local_1e4 = iVar13 + local_1e4;
    pDVar2 = this->_data;
    if (0 < pDVar2->missingScanLines) {
      ppLVar3 = (pDVar2->lineBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pLVar4 = ppLVar3[(ulong)(long)iVar13 %
                       (ulong)((long)(pDVar2->lineBuffers).
                                     super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar3 >> 3
                              )];
      IlmThread_3_4::Semaphore::wait();
      iVar10 = (pLVar4->scanLineMax - pLVar4->scanLineMin) + 1;
      pDVar2 = this->_data;
      pDVar2->missingScanLines = pDVar2->missingScanLines - iVar10;
      if (pLVar4->partiallyFull == true) {
        pDVar2->currentScanLine = pDVar2->currentScanLine + iVar10 * iVar12;
        IlmThread_3_4::Semaphore::post();
        uVar7 = 1;
      }
      else {
        anon_unknown_7::writePixelData
                  (pDVar2->_streamData,pDVar2,pLVar4->minY,pLVar4->dataPtr,pLVar4->dataSize,
                   pLVar4->uncompressedDataSize,pLVar4->sampleCountTablePtr,
                   pLVar4->sampleCountTableSize);
        piVar1 = &this->_data->currentScanLine;
        *piVar1 = *piVar1 + iVar10 * iVar12;
        IlmThread_3_4::Semaphore::post();
        if (iVar13 + iVar12 == local_1d4) {
          uVar7 = 9;
        }
        else if (local_1e4 == local_1d4) {
          uVar7 = 8;
        }
        else {
          pLVar8 = (LineBufferTask *)operator_new(0x20);
          anon_unknown_7::LineBufferTask::LineBufferTask
                    (pLVar8,local_1b8,this->_data,local_1e4,iVar6,local_1c4);
          IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pLVar8);
          uVar7 = 0;
        }
      }
      (*(code *)((long)&DAT_001b48a0 + (long)(int)(&DAT_001b48a0)[uVar7]))();
      return;
    }
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc
              (pAVar9,"Tried to write more scan lines than specified by the data window.");
    __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar9,"No frame buffer specified as pixel data source.");
  __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineOutputFile::writePixels (int numScanLines)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first =
            (_data->currentScanLine - _data->minY) / _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
            // all tasks are complete.
            //

            TaskGroup taskGroup;

            //
            // Determine the range of lineBuffers that intersect the scan
            // line range.  Then add the initial compression tasks to the
            // thread pool.  We always add in at least one task but the
            // individual task might not do anything if numScanLines == 0.
            //

            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), last - first + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first + i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first + numTasks;
                stop               = last + 1;
                step               = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), first - last + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first - i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first - numTasks;
                stop               = last - 1;
                step               = -1;
            }

            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc (
                        "Tried to write more scan lines "
                        "than specified by the data window.");
                }

                //
                // Wait until the next line buffer is ready to be written
                //

                LineBuffer* writeBuffer =
                    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                int numLines =
                    writeBuffer->scanLineMax - writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;

                //
                // If the line buffer is only partially full, then it is
                // not complete and we cannot write it to disk yet.
                //

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine =
                        _data->currentScanLine + step * numLines;
                    writeBuffer->post ();

                    return;
                }

                //
                // Write the line buffer
                //

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine =
                    _data->currentScanLine + step * numLines;

#ifdef DEBUG

                assert (
                    _data->currentScanLine ==
                    ((_data->lineOrder == INCREASING_Y)
                         ? writeBuffer->scanLineMax + 1
                         : writeBuffer->scanLineMin - 1));

#endif

                //
                // Release the lock on the line buffer
                //

                writeBuffer->post ();

                //
                // If this was the last line buffer in the scanline range
                //

                if (nextWriteBuffer == stop) break;

                //
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
                //

                if (nextCompressBuffer == stop) continue;

                //
                // Add nextCompressBuffer as a compression task
                //

                ThreadPool::addGlobalTask (new LineBufferTask (
                    &taskGroup,
                    _data,
                    nextCompressBuffer,
                    scanLineMin,
                    scanLineMax));

                //
                // Update the next line buffer we need to compress
                //

                nextCompressBuffer += step;
            }

            //
            // Finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to OutputFile::writePixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
        {
            LineBuffer* lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}